

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O2

void __thiscall absl::base_internal::LowLevelAlloc::Arena::Arena(Arena *this,uint32_t flags_value)

{
  size_t sVar1;
  
  SpinLock::SpinLock(&this->mu,SCHEDULE_KERNEL_ONLY);
  this->allocation_count = 0;
  this->flags = flags_value;
  sVar1 = sysconf(0x1e);
  this->pagesize = sVar1;
  this->round_up = 0x20;
  this->min_size = 0x40;
  this->random = 0;
  (this->freelist).header.size = 0;
  (this->freelist).header.magic = (ulong)&this->freelist ^ 0xffffffffb37cc16a;
  (this->freelist).header.arena = this;
  (this->freelist).levels = 0;
  memset((this->freelist).next,0,0xf0);
  return;
}

Assistant:

LowLevelAlloc::Arena::Arena(uint32_t flags_value)
    : mu(base_internal::SCHEDULE_KERNEL_ONLY),
      allocation_count(0),
      flags(flags_value),
      pagesize(GetPageSize()),
      round_up(RoundedUpBlockSize()),
      min_size(2 * round_up),
      random(0) {
  freelist.header.size = 0;
  freelist.header.magic =
      Magic(kMagicUnallocated, &freelist.header);
  freelist.header.arena = this;
  freelist.levels = 0;
  memset(freelist.next, 0, sizeof(freelist.next));
}